

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

ast * sibling(ast *a,int n)

{
  ast *ret;
  int n_local;
  ast *a_local;
  
  ret = a;
  n_local = n;
  if (n < 0) {
    n_local = -n;
    for (; n_local != 0 && ret != (ast *)0x0; ret = ret->pre) {
      n_local = n_local + -1;
    }
  }
  else {
    for (; n_local != 0 && ret != (ast *)0x0; ret = ret->right) {
      n_local = n_local + -1;
    }
  }
  return ret;
}

Assistant:

struct ast *sibling(struct ast *a, int n) {
    struct ast *ret = a;
    if (n >= 0) {
        while (n-- && ret)
            ret = ret->right;
    }
    else {
        n = -n;
        while (n-- && ret)
            ret = ret->pre;
    }
    return ret;
}